

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_filter.c
# Opt level: O0

void * sighip_new(t_floatarg f)

{
  t_sighip *x_00;
  t_symbol *s1;
  t_symbol *s2;
  t_sighip *x;
  t_floatarg f_local;
  
  x_00 = (t_sighip *)pd_new(sighip_class);
  s1 = gensym("float");
  s2 = gensym("ft1");
  inlet_new((t_object *)x_00,(t_pd *)x_00,s1,s2);
  outlet_new((t_object *)x_00,&s_signal);
  x_00->x_sr = 44100.0;
  (x_00->x_cspace).c_x = 0.0;
  sighip_ft1(x_00,f);
  x_00->x_f = 0.0;
  return x_00;
}

Assistant:

static void *sighip_new(t_floatarg f)
{
    t_sighip *x = (t_sighip *)pd_new(sighip_class);
    inlet_new(&x->x_obj, &x->x_obj.ob_pd, gensym("float"), gensym("ft1"));
    outlet_new(&x->x_obj, &s_signal);
    x->x_sr = 44100;
    x->x_cspace.c_x = 0;
    sighip_ft1(x, f);
    x->x_f = 0;
    return (x);
}